

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

bool __thiscall graphics101::Mesh::loadFromOBJ(Mesh *this,string *path)

{
  pointer *this_00;
  int iVar1;
  byte bVar2;
  bool bVar3;
  ulong uVar4;
  void *pvVar5;
  size_type sVar6;
  reference str;
  reference pvVar7;
  size_type sVar8;
  reference pvVar9;
  reference pvVar10;
  ostream *poVar11;
  int local_4a4;
  int iStack_4a0;
  int i_1;
  int local_498;
  int local_494;
  undefined1 local_490 [4];
  int i;
  vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
  vb;
  string b;
  undefined1 local_458 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fb;
  float local_438;
  float local_434;
  real y_2;
  real x_2;
  float local_424;
  float local_420;
  real z_1;
  real y_1;
  real x_1;
  float local_40c;
  float local_408;
  real z;
  real y;
  real x;
  string first_word;
  istringstream local_3e0 [8];
  istringstream linestream;
  string local_260 [8];
  string line;
  long local_230;
  ifstream mesh;
  int local_24;
  int num_quads_triangulated;
  string *path_local;
  Mesh *this_local;
  
  clear(this);
  local_24 = 0;
  std::ifstream::ifstream(&local_230,path,8);
  bVar2 = std::ios::operator!((ios *)((long)&local_230 + *(long *)(local_230 + -0x18)));
  if ((bVar2 & 1) == 0) {
    while( true ) {
      std::istream::operator>>(&local_230,std::ws<char,std::char_traits<char>>);
      bVar2 = std::ios::eof();
      if (((bVar2 ^ 0xff) & 1) == 0) break;
      std::__cxx11::string::string(local_260);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&local_230,local_260);
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        std::__cxx11::istringstream::istringstream(local_3e0,local_260,8);
        std::__cxx11::string::string((string *)&y);
        std::operator>>((istream *)local_3e0,(string *)&y);
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&y,"v");
        if (bVar3) {
          pvVar5 = (void *)std::istream::operator>>(local_3e0,&z);
          pvVar5 = (void *)std::istream::operator>>(pvVar5,&local_408);
          std::istream::operator>>(pvVar5,&local_40c);
          glm::vec<3,_float,_(glm::qualifier)0>::vec
                    ((vec<3,_float,_(glm::qualifier)0> *)&y_1,z,local_408,local_40c);
          std::
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          ::push_back(&this->positions,(value_type *)&y_1);
        }
        else {
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&y,"vn");
          if (bVar3) {
            pvVar5 = (void *)std::istream::operator>>(local_3e0,&z_1);
            pvVar5 = (void *)std::istream::operator>>(pvVar5,&local_420);
            std::istream::operator>>(pvVar5,&local_424);
            glm::vec<3,_float,_(glm::qualifier)0>::vec
                      ((vec<3,_float,_(glm::qualifier)0> *)&y_2,z_1,local_420,local_424);
            std::
            vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            ::push_back(&this->normals,(value_type *)&y_2);
          }
          else {
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&y,"vt");
            if (bVar3) {
              pvVar5 = (void *)std::istream::operator>>(local_3e0,&local_434);
              std::istream::operator>>(pvVar5,&local_438);
              glm::vec<2,_float,_(glm::qualifier)0>::vec
                        ((vec<2,_float,_(glm::qualifier)0> *)
                         &fb.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,local_434,local_438);
              std::
              vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
              ::push_back(&this->texcoords,
                          (value_type *)
                          &fb.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
            }
            else {
              bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&y,"f");
              if (bVar3) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_458);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_458,4);
                while( true ) {
                  std::istream::operator>>(local_3e0,std::ws<char,std::char_traits<char>>);
                  bVar2 = std::ios::eof();
                  if (((bVar2 ^ 0xff) & 1) == 0) break;
                  this_00 = &vb.
                             super__Vector_base<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  std::__cxx11::string::string((string *)this_00);
                  std::operator>>((istream *)local_3e0,(string *)this_00);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_458,
                              (value_type *)
                              &vb.
                               super__Vector_base<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  std::__cxx11::string::~string
                            ((string *)
                             &vb.
                              super__Vector_base<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                }
                sVar6 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_458);
                if (sVar6 < 3) {
                  std::operator<<((ostream *)&std::cerr,
                                  "ERROR: Skipping a face with less than 3 vertices.\n");
                }
                else {
                  std::
                  vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                  ::vector((vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                            *)local_490);
                  sVar6 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_458);
                  std::
                  vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                  ::resize((vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                            *)local_490,sVar6);
                  for (local_494 = 0; uVar4 = (ulong)local_494,
                      sVar6 = std::
                              vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                              ::size((vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                                      *)local_490), uVar4 < sVar6; local_494 = local_494 + 1) {
                    str = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)local_458,(long)local_494);
                    anon_unknown.dwarf_95256::VertexBundle::VertexBundle
                              ((VertexBundle *)&stack0xfffffffffffffb60,str);
                    pvVar7 = std::
                             vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                             ::operator[]((vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                                           *)local_490,(long)local_494);
                    pvVar7->v = iStack_4a0;
                    pvVar7->vt = i_1;
                    pvVar7->vn = local_498;
                    pvVar7 = std::
                             vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                             ::operator[]((vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                                           *)local_490,(long)local_494);
                    if (pvVar7->v == 0) {
                      __assert_fail("vb[i].v != 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/yig[P]graphics101-pipeline/src/mesh.cpp"
                                    ,0xd9,"bool graphics101::Mesh::loadFromOBJ(const std::string &)"
                                   );
                    }
                    pvVar7 = std::
                             vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                             ::operator[]((vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                                           *)local_490,(long)local_494);
                    if (pvVar7->v < 0) {
                      sVar6 = std::
                              vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                              ::size(&this->positions);
                      pvVar7 = std::
                               vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                               ::operator[]((vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                                             *)local_490,(long)local_494);
                      pvVar7->v = pvVar7->v + (int)sVar6;
                    }
                    else {
                      pvVar7 = std::
                               vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                               ::operator[]((vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                                             *)local_490,(long)local_494);
                      pvVar7->v = pvVar7->v + -1;
                    }
                    pvVar7 = std::
                             vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                             ::operator[]((vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                                           *)local_490,(long)local_494);
                    if (pvVar7->vt < 0) {
                      sVar6 = std::
                              vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                              ::size(&this->texcoords);
                      pvVar7 = std::
                               vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                               ::operator[]((vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                                             *)local_490,(long)local_494);
                      pvVar7->vt = pvVar7->vt + (int)sVar6;
                    }
                    else {
                      pvVar7 = std::
                               vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                               ::operator[]((vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                                             *)local_490,(long)local_494);
                      pvVar7->vt = pvVar7->vt + -1;
                    }
                    pvVar7 = std::
                             vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                             ::operator[]((vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                                           *)local_490,(long)local_494);
                    if (pvVar7->vn < 0) {
                      sVar6 = std::
                              vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                              ::size(&this->normals);
                      pvVar7 = std::
                               vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                               ::operator[]((vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                                             *)local_490,(long)local_494);
                      pvVar7->vn = pvVar7->vn + (int)sVar6;
                    }
                    else {
                      pvVar7 = std::
                               vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                               ::operator[]((vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                                             *)local_490,(long)local_494);
                      pvVar7->vn = pvVar7->vn + -1;
                    }
                  }
                  sVar6 = std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                          ::size(&this->face_normals);
                  bVar3 = true;
                  if (sVar6 != 0) {
                    sVar6 = std::
                            vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>::
                            size(&this->face_normals);
                    sVar8 = std::
                            vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>::
                            size(&this->face_positions);
                    bVar3 = sVar6 == sVar8;
                  }
                  if (!bVar3) {
                    __assert_fail("face_normals.size() == 0 || face_normals.size() == face_positions.size()"
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/yig[P]graphics101-pipeline/src/mesh.cpp"
                                  ,0xe4,"bool graphics101::Mesh::loadFromOBJ(const std::string &)");
                  }
                  sVar6 = std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                          ::size(&this->face_texcoords);
                  bVar3 = true;
                  if (sVar6 != 0) {
                    sVar6 = std::
                            vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>::
                            size(&this->face_texcoords);
                    sVar8 = std::
                            vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>::
                            size(&this->face_positions);
                    bVar3 = sVar6 == sVar8;
                  }
                  if (!bVar3) {
                    __assert_fail("face_texcoords.size() == 0 || face_texcoords.size() == face_positions.size()"
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/yig[P]graphics101-pipeline/src/mesh.cpp"
                                  ,0xe5,"bool graphics101::Mesh::loadFromOBJ(const std::string &)");
                  }
                  sVar6 = std::
                          vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                          ::size((vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                                  *)local_490);
                  if (sVar6 != 3) {
                    sVar6 = std::
                            vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                            ::size((vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                                    *)local_490);
                    if (sVar6 == 4) {
                      local_24 = local_24 + 1;
                    }
                    else {
                      poVar11 = std::operator<<((ostream *)&std::cerr,"Triangulating a face with ");
                      sVar6 = std::
                              vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                              ::size((vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                                      *)local_490);
                      poVar11 = (ostream *)std::ostream::operator<<(poVar11,sVar6);
                      std::operator<<(poVar11," vertices.\n");
                    }
                  }
                  for (local_4a4 = 2;
                      sVar6 = std::
                              vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                              ::size((vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                                      *)local_490), (ulong)(long)local_4a4 < sVar6;
                      local_4a4 = local_4a4 + 1) {
                    pvVar7 = std::
                             vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                             ::operator[]((vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                                           *)local_490,0);
                    pvVar9 = std::
                             vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                             ::operator[]((vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                                           *)local_490,(long)(local_4a4 + -1));
                    pvVar10 = std::
                              vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                              ::operator[]((vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                                            *)local_490,(long)local_4a4);
                    std::vector<graphics101::Triangle,std::allocator<graphics101::Triangle>>::
                    emplace_back<int&,int&,int&>
                              ((vector<graphics101::Triangle,std::allocator<graphics101::Triangle>>
                                *)&this->face_positions,&pvVar7->v,&pvVar9->v,&pvVar10->v);
                    pvVar7 = std::
                             vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                             ::operator[]((vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                                           *)local_490,0);
                    iVar1 = pvVar7->vn;
                    pvVar7 = std::
                             vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                             ::operator[]((vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                                           *)local_490,(long)(local_4a4 + -1));
                    if ((iVar1 == -1) != (pvVar7->vn == -1)) {
                      __assert_fail("( vb[0].vn == -1 ) == ( vb[i-1].vn == -1 )",
                                    "/workspace/llm4binary/github/license_c_cmakelists/yig[P]graphics101-pipeline/src/mesh.cpp"
                                    ,0xf7,"bool graphics101::Mesh::loadFromOBJ(const std::string &)"
                                   );
                    }
                    pvVar7 = std::
                             vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                             ::operator[]((vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                                           *)local_490,0);
                    iVar1 = pvVar7->vn;
                    pvVar7 = std::
                             vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                             ::operator[]((vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                                           *)local_490,(long)local_4a4);
                    if ((iVar1 == -1) != (pvVar7->vn == -1)) {
                      __assert_fail("( vb[0].vn == -1 ) == ( vb[i].vn == -1 )",
                                    "/workspace/llm4binary/github/license_c_cmakelists/yig[P]graphics101-pipeline/src/mesh.cpp"
                                    ,0xf8,"bool graphics101::Mesh::loadFromOBJ(const std::string &)"
                                   );
                    }
                    pvVar7 = std::
                             vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                             ::operator[]((vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                                           *)local_490,0);
                    iVar1 = pvVar7->vt;
                    pvVar7 = std::
                             vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                             ::operator[]((vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                                           *)local_490,(long)(local_4a4 + -1));
                    if ((iVar1 == -1) != (pvVar7->vt == -1)) {
                      __assert_fail("( vb[0].vt == -1 ) == ( vb[i-1].vt == -1 )",
                                    "/workspace/llm4binary/github/license_c_cmakelists/yig[P]graphics101-pipeline/src/mesh.cpp"
                                    ,0xf9,"bool graphics101::Mesh::loadFromOBJ(const std::string &)"
                                   );
                    }
                    pvVar7 = std::
                             vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                             ::operator[]((vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                                           *)local_490,0);
                    iVar1 = pvVar7->vt;
                    pvVar7 = std::
                             vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                             ::operator[]((vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                                           *)local_490,(long)local_4a4);
                    if ((iVar1 == -1) != (pvVar7->vt == -1)) {
                      __assert_fail("( vb[0].vt == -1 ) == ( vb[i].vt == -1 )",
                                    "/workspace/llm4binary/github/license_c_cmakelists/yig[P]graphics101-pipeline/src/mesh.cpp"
                                    ,0xfa,"bool graphics101::Mesh::loadFromOBJ(const std::string &)"
                                   );
                    }
                    pvVar7 = std::
                             vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                             ::operator[]((vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                                           *)local_490,0);
                    if (pvVar7->vn != -1) {
                      pvVar7 = std::
                               vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                               ::operator[]((vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                                             *)local_490,0);
                      pvVar9 = std::
                               vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                               ::operator[]((vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                                             *)local_490,(long)(local_4a4 + -1));
                      pvVar10 = std::
                                vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                                ::operator[]((vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                                              *)local_490,(long)local_4a4);
                      std::vector<graphics101::Triangle,std::allocator<graphics101::Triangle>>::
                      emplace_back<int&,int&,int&>
                                ((vector<graphics101::Triangle,std::allocator<graphics101::Triangle>>
                                  *)&this->face_normals,&pvVar7->vn,&pvVar9->vn,&pvVar10->vn);
                    }
                    pvVar7 = std::
                             vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                             ::operator[]((vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                                           *)local_490,0);
                    if (pvVar7->vt != -1) {
                      pvVar7 = std::
                               vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                               ::operator[]((vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                                             *)local_490,0);
                      pvVar9 = std::
                               vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                               ::operator[]((vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                                             *)local_490,(long)(local_4a4 + -1));
                      pvVar10 = std::
                                vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                                ::operator[]((vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                                              *)local_490,(long)local_4a4);
                      std::vector<graphics101::Triangle,std::allocator<graphics101::Triangle>>::
                      emplace_back<int&,int&,int&>
                                ((vector<graphics101::Triangle,std::allocator<graphics101::Triangle>>
                                  *)&this->face_texcoords,&pvVar7->vt,&pvVar9->vt,&pvVar10->vt);
                    }
                  }
                  std::
                  vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                  ::~vector((vector<(anonymous_namespace)::VertexBundle,_std::allocator<(anonymous_namespace)::VertexBundle>_>
                             *)local_490);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_458);
              }
            }
          }
        }
        std::__cxx11::string::~string((string *)&y);
        std::__cxx11::istringstream::~istringstream(local_3e0);
      }
      std::__cxx11::string::~string(local_260);
    }
    if (0 < local_24) {
      poVar11 = std::operator<<((ostream *)&std::cerr,"Triangulated ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_24);
      std::operator<<(poVar11," quadrilaterals.\n");
    }
    this_local._7_1_ = true;
  }
  else {
    poVar11 = std::operator<<((ostream *)&std::cerr,"ERROR: Unable to access path: ");
    poVar11 = std::operator<<(poVar11,(string *)path);
    std::operator<<(poVar11,'\n');
    this_local._7_1_ = false;
  }
  std::ifstream::~ifstream(&local_230);
  return this_local._7_1_;
}

Assistant:

bool Mesh::loadFromOBJ( const std::string& path ) {
    using namespace std;
    
    clear();
    
    // TODO: Error checking with a printout to std::cerr and return false.
    
    // Print the number of quads triangulated only once. Keep track of the count.
    int num_quads_triangulated = 0;
    
    // Open the file.
    ifstream mesh( path );
    if( !mesh ) {
        cerr << "ERROR: Unable to access path: " << path << '\n';
        return false;
    }
    while( !( mesh >> ws ).eof() ) {
        // Get each line.
        string line;
        getline( mesh, line );
        
        // Skip blank lines.
        if( line.empty() ) continue;
        
        istringstream linestream( line );
        
        // Get the first word.
        string first_word;
        linestream >> first_word;
        
        if( first_word == "v" ) {
            real x,y,z;
            linestream >> x >> y >> z;
            positions.push_back( vec3( x,y,z ) );
        }
        else if( first_word == "vn" ) {
            real x,y,z;
            linestream >> x >> y >> z;
            normals.push_back( vec3( x,y,z ) );
        }
        else if( first_word == "vt" ) {
            real x,y;
            linestream >> x >> y;
            texcoords.push_back( vec2( x,y ) );
        }
        else if( first_word == "f" ) {
            std::vector< string > fb;
            fb.reserve( 4 );
            while( !( linestream >> ws ).eof() ) {
                string b;
                linestream >> b;
                fb.push_back( b );
            }
            if( fb.size() < 3 ) {
                cerr << "ERROR: Skipping a face with less than 3 vertices.\n";
                continue;
            }
            
            // OBJ files are 1-indexed
            // Negative indices subtract.
            
            std::vector< VertexBundle > vb;
            vb.resize( fb.size() );
            for( int i = 0; i < vb.size(); ++i ) {
                // Convert the string separated by slashes to integers.
                vb[i] = VertexBundle( fb[i] );
                
                // We must have positions, so they can't be zero.
                assert( vb[i].v != 0 );
                
                // If any index is negative, add it to that attribute's length.
                // Otherwise, subtract 1.
                if( vb[i].v  < 0 ) vb[i].v  += positions.size(); else vb[i].v  -= 1;
                if( vb[i].vt < 0 ) vb[i].vt += texcoords.size(); else vb[i].vt -= 1;
                if( vb[i].vn < 0 ) vb[i].vn += normals.size();   else vb[i].vn -= 1;
            }
            
            // We either have no normals/texcoords or we have normal/texcoord faces
            // in correspondence with position faces.
            assert( face_normals.size() == 0 || face_normals.size() == face_positions.size() );
            assert( face_texcoords.size() == 0 || face_texcoords.size() == face_positions.size() );
            
            // Add all the faces.
            if( vb.size() != 3 ) {
                if( vb.size() == 4 ) {
                    num_quads_triangulated += 1;
                } else {
                    cerr << "Triangulating a face with " << vb.size() << " vertices.\n";
                }
            }
            for( int i = 2; i < vb.size(); ++i ) {
                // Add the position face.
                face_positions.emplace_back( vb[0].v, vb[i-1].v, vb[i].v );
                
                // If one vertex bundle has normals or texcoords,
                // they all must have normals/texcoords.
                // We have already converted the OBJ coordinates back to 0-indexing,
                // so check for -1.
                assert( ( vb[0].vn == -1 ) == ( vb[i-1].vn == -1 ) );
                assert( ( vb[0].vn == -1 ) == ( vb[i].vn == -1 ) );
                assert( ( vb[0].vt == -1 ) == ( vb[i-1].vt == -1 ) );
                assert( ( vb[0].vt == -1 ) == ( vb[i].vt == -1 ) );
                
                if( vb[0].vn != -1 ) {
                    face_normals.emplace_back( vb[0].vn, vb[i-1].vn, vb[i].vn );
                }
                
                if( vb[0].vt != -1 ) {
                    face_texcoords.emplace_back( vb[0].vt, vb[i-1].vt, vb[i].vt );
                }
            }
        }
    }
    
    if( num_quads_triangulated > 0 ) {
        cerr << "Triangulated " << num_quads_triangulated << " quadrilaterals.\n";
    }
    
    return true;
}